

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void counting_callback_fn(char *str,void *data)

{
  long lVar1;
  ulong extraout_RDX;
  ulong __n;
  
  if (*data != 0x7fffffff) {
    *(int *)data = *data + 1;
    return;
  }
  counting_callback_fn_cold_1();
  __n = (extraout_RDX - 1 & 0xfffffffffffffff0) + 0x10;
  if (extraout_RDX <= __n) {
    lVar1 = 0;
    do {
      if (*(char *)((long)data + lVar1) != "scratch"[lVar1]) {
        (**(code **)str)("invalid scratch space",*(undefined8 *)(str + 8));
        return;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 8);
    if (__n <= (ulong)(*(long *)((long)data + 0x18) - *(long *)((long)data + 0x10))) {
      memset((void *)(*(long *)((long)data + 0x10) + *(long *)((long)data + 8)),0,__n);
      *(long *)((long)data + 0x10) = *(long *)((long)data + 0x10) + __n;
    }
  }
  return;
}

Assistant:

static void counting_callback_fn(const char* str, void* data) {
    /* Dummy callback function that just counts. */
    int32_t *p;
    (void)str;
    p = data;
    CHECK(*p != INT32_MAX);
    (*p)++;
}